

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O3

Light_SampleRes *
embree::SpotLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar12 = (float)super[4].type - (dg->P).field_0.m128[0];
  fVar13 = (float)super[5].type - (dg->P).field_0.m128[1];
  fVar14 = (float)super[6].type - (dg->P).field_0.m128[2];
  fVar15 = (float)super[7].type - (dg->P).field_0.m128[3];
  fVar8 = (float)super[0x1a].type;
  if (fVar8 <= 0.0) {
    fVar8 = (float)super[0x10].type;
    fVar2 = (float)super[0x11].type;
    fVar9 = (float)super[0x12].type;
    bVar1 = false;
  }
  else {
    fVar2 = (s->field_0).field_0.x;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar8 = fVar8 * fVar2;
    fVar2 = (s->field_0).field_0.y * 6.2831855;
    fVar3 = sinf(fVar2);
    fVar4 = cosf(fVar2);
    fVar4 = fVar4 * fVar8;
    fVar3 = fVar3 * fVar8;
    fVar8 = (float)super[0x10].type;
    fVar2 = (float)super[0x11].type;
    fVar9 = (float)super[0x12].type;
    fVar12 = fVar12 + fVar4 * (float)super[8].type + fVar3 * (float)super[0xc].type + fVar8 * 0.0;
    fVar13 = fVar13 + fVar4 * (float)super[9].type + fVar3 * (float)super[0xd].type + fVar2 * 0.0;
    fVar14 = fVar14 + fVar4 * (float)super[10].type + fVar3 * (float)super[0xe].type + fVar9 * 0.0;
    fVar15 = fVar15 + fVar4 * (float)super[0xb].type +
                      fVar3 * (float)super[0xf].type + (float)super[0x13].type * 0.0;
    bVar1 = 0.0 < (float)super[0x1a].type;
  }
  fVar3 = fVar13 * fVar13;
  fVar4 = fVar14 * fVar14;
  fVar7 = fVar15 * fVar15;
  fVar10 = fVar3 + fVar12 * fVar12 + fVar4;
  fVar11 = fVar3 + fVar3 + fVar7;
  fVar4 = fVar3 + fVar4 + fVar4;
  fVar7 = fVar3 + fVar7 + fVar7;
  auVar5._4_4_ = fVar11;
  auVar5._0_4_ = fVar10;
  auVar5._8_4_ = fVar4;
  auVar5._12_4_ = fVar7;
  auVar6._4_4_ = fVar11;
  auVar6._0_4_ = fVar10;
  auVar6._8_4_ = fVar4;
  auVar6._12_4_ = fVar7;
  auVar6 = rsqrtss(auVar5,auVar6);
  fVar3 = auVar6._0_4_;
  fVar3 = fVar3 * fVar3 * fVar10 * -0.5 * fVar3 + fVar3 * 1.5;
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar3 * fVar12;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar3 * fVar13;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar3 * fVar14;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar3 * fVar15;
  __return_storage_ptr__->dist = fVar10 * fVar3;
  fVar13 = fVar3 * fVar14 * fVar9 + fVar3 * fVar13 * fVar2 + fVar3 * fVar12 * fVar8;
  fVar8 = (float)super[0x18].type;
  fVar12 = (float)super[0x19].type;
  if (bVar1) {
    fVar14 = ABS(fVar13) * fVar10 * (float)super[0x1b].type;
  }
  else {
    fVar14 = INFINITY;
  }
  __return_storage_ptr__->pdf = fVar14;
  fVar12 = fVar12 * (-fVar13 - fVar8);
  if (1.0 <= fVar12) {
    fVar12 = 1.0;
  }
  fVar8 = 0.0;
  if (0.0 <= fVar12) {
    fVar8 = fVar12;
  }
  fVar8 = fVar3 * fVar3 * fVar8;
  fVar12 = (float)super[0x15].type;
  fVar13 = (float)super[0x16].type;
  fVar14 = (float)super[0x17].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar8 * (float)super[0x14].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar8 * fVar12;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar8 * fVar13;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar8 * fVar14;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes SpotLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const SpotLight* self = (SpotLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  res.dir = self->position - dg.P;

  if (self->radius > 0.0f)
    res.dir = self->frame * uniformSampleDisk(self->radius, s) + res.dir;

  const float dist2 = dot(res.dir, res.dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = res.dir * invdist;
  res.dist = dist2 * invdist;

  // cosine of the negated light direction and light vector.
  const float cosAngle = -dot(self->frame.vz, res.dir);
  const float angularAttenuation = clamp((cosAngle - self->cosAngleMax) * self->cosAngleScale);

  if (self->radius > 0.0f)
    res.pdf = self->diskPdf * dist2 * abs(cosAngle);
  else
    res.pdf = inf; // we always take this res

  // convert from power to radiance by attenuating by distance^2; attenuate by angle
  res.weight = self->power * (sqr(invdist) * angularAttenuation);

  return res;
}